

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O1

void __thiscall FRemapTable::Serialize(FRemapTable *this,FSerializer *arc)

{
  int iVar1;
  
  iVar1 = this->NumEntries;
  ::Serialize(arc,"numentries",&this->NumEntries,(int32_t *)0x0);
  if ((arc->r != (FReader *)0x0) && (iVar1 != this->NumEntries)) {
    Free(this);
    Alloc(this,this->NumEntries);
  }
  FSerializer::Array<unsigned_char>(arc,"remap",this->Remap,this->NumEntries,false);
  FSerializer::Array<PalEntry>(arc,"palette",this->Palette,this->NumEntries,false);
  return;
}

Assistant:

void FRemapTable::Serialize(FSerializer &arc)
{
	int n = NumEntries;

	arc("numentries", NumEntries);
	if (arc.isReading())
	{
		if (n != NumEntries)
		{
			Free();
			Alloc(NumEntries);
		}
	}
	arc.Array("remap", Remap, NumEntries);
	arc.Array("palette", Palette, NumEntries);
}